

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O2

bool __thiscall
WorldShuffler::generate_region_requirement_hint(WorldShuffler *this,HintSource *hint_source)

{
  string *__rhs;
  WorldNode *end_node;
  WorldRegion *pWVar1;
  bool bVar2;
  WorldNode *start_node;
  pointer ppWVar3;
  WorldRegion *region;
  WorldSolver solver;
  WorldRegion *local_1a8;
  WorldRegion *local_1a0;
  vector<WorldRegion_*,_std::allocator<WorldRegion_*>_> *local_198;
  pointer local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  WorldSolver local_168;
  
  local_198 = &this->_hintable_region_requirements;
  ppWVar3 = (this->_hintable_region_requirements).
            super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_190 = (this->_hintable_region_requirements).
              super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_1a0 = (WorldRegion *)0x0;
  do {
    if (ppWVar3 == local_190) break;
    local_1a8 = *ppWVar3;
    WorldSolver::WorldSolver(&local_168,this->_world);
    WorldSolver::forbid_taking_items_from_nodes(&local_168,&local_1a8->_nodes);
    start_node = RandomizerWorld::spawn_node(this->_world);
    end_node = hint_source->_node;
    World::starting_inventory
              ((vector<Item_*,_std::allocator<Item_*>_> *)&local_188,&this->_world->super_World);
    bVar2 = WorldSolver::try_to_solve
                      (&local_168,start_node,end_node,
                       (vector<Item_*,_std::allocator<Item_*>_> *)&local_188);
    std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base
              ((_Vector_base<Item_*,_std::allocator<Item_*>_> *)&local_188);
    if (bVar2) {
      local_1a0 = local_1a8;
      vectools::erase_first<WorldRegion*>(local_198,&local_1a8);
    }
    WorldSolver::~WorldSolver(&local_168);
    ppWVar3 = ppWVar3 + 1;
  } while (!bVar2);
  pWVar1 = local_1a0;
  if (local_1a0 != (WorldRegion *)0x0) {
    bVar2 = is_region_avoidable(this,local_1a0);
    __rhs = &pWVar1->_hint_name;
    if (bVar2) {
      std::operator+(&local_188,"What you are looking for is not ",__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168
                     ,&local_188,".");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&hint_source->_text,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168);
    }
    else {
      std::operator+(&local_188,"You might have a pleasant surprise wandering ",__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168
                     ,&local_188,".");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&hint_source->_text,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168);
    }
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
  }
  return pWVar1 != (WorldRegion *)0x0;
}

Assistant:

bool WorldShuffler::generate_region_requirement_hint(HintSource* hint_source)
{
    WorldRegion* hinted_region = nullptr;
    for(WorldRegion* region : _hintable_region_requirements)
    {
        // Check that taking items from region is not mandatory to reach the hint source
        WorldSolver solver(_world);
        solver.forbid_taking_items_from_nodes(region->nodes());
        if(!solver.try_to_solve(_world.spawn_node(), hint_source->node(), _world.starting_inventory()))
            continue;

        hinted_region = region;
        vectools::erase_first(_hintable_region_requirements, region);
        break;
    }

    if(!hinted_region)
        return false;

    if (this->is_region_avoidable(hinted_region))
        hint_source->text("What you are looking for is not " + hinted_region->hint_name() + ".");
    else
        hint_source->text("You might have a pleasant surprise wandering " + hinted_region->hint_name() + ".");

    return true;
}